

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

Variable __thiscall
LiteScript::Class::CreateElement
          (Class *this,State *state,
          vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *args,Variable *self)

{
  ClassObject *this_00;
  char *name;
  Object *pOVar1;
  Type *pTVar2;
  uint *extraout_RDX;
  Variable *in_R8;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  Variable VVar6;
  undefined1 local_70 [48];
  Variable local_40;
  
  Memory::Create((Memory *)this,
                 (Type *)state[4].call_lifo.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
  pOVar1 = Variable::operator->((Variable *)this);
  this_00 = (ClassObject *)pOVar1->data;
  this_00->ClassBase = (Class *)state;
  uVar4 = ((long)(state->args_tmp).
                 super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(state->args_tmp).
                super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x30 & 0xffffffff;
  lVar3 = 0x20;
  while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
    pOVar1 = Variable::operator->
                       ((Variable *)
                        ((long)&(((state->args_tmp).
                                  super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                )._M_impl.super__Vector_impl_data + lVar3));
    pTVar2 = Object::GetType(pOVar1);
    bVar5 = Type::operator!=(pTVar2,(Type *)_type_callback);
    if (bVar5) {
      name = *(char **)((long)(state->args_tmp).
                              super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x20);
      Memory::Create((Memory *)local_70,
                     (Type *)state[4].call_lifo.
                             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
      ClassObject::AddMember(this_00,name,(Variable *)local_70);
      Variable::~Variable((Variable *)local_70);
      ClassObject::GetMemberVariable((ClassObject *)local_70,(uint)this_00);
      Variable::operator=(&local_40,(Variable *)local_70);
      Variable::~Variable(&local_40);
      Variable::~Variable((Variable *)local_70);
    }
    lVar3 = lVar3 + 0x30;
  }
  lVar3 = (long)*(int *)&state[4].call_lifo.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
  if (lVar3 != -1) {
    pOVar1 = Variable::operator->
                       ((Variable *)
                        ((long)&(state->args_tmp).
                                super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar3 * 2 + 1].
                                super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                ._M_impl.super__Vector_impl_data + 8));
    pTVar2 = Object::GetType(pOVar1);
    bVar5 = Type::operator==(pTVar2,(Type *)_type_callback);
    if (bVar5) {
      Nullable<LiteScript::Variable>::Nullable
                ((Nullable<LiteScript::Variable> *)local_70,(Variable *)this);
      pOVar1 = Variable::operator->
                         ((Variable *)
                          ((long)&(state->args_tmp).
                                  super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [(long)*(int *)&state[4].call_lifo.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start * 2 + 1]
                                  .
                                  super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                  ._M_impl.super__Vector_impl_data + 8));
      Nullable<LiteScript::Variable>::operator=
                ((Nullable<LiteScript::Variable> *)((long)pOVar1->data + 0x20),
                 (Nullable<LiteScript::Variable> *)local_70);
      Nullable<LiteScript::Variable>::Nullify((Nullable<LiteScript::Variable> *)local_70);
      Variable::operator()
                ((Variable *)(local_70 + 0x20),
                 (State *)((long)&(state->args_tmp).
                                  super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [(long)*(int *)&state[4].call_lifo.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start * 2 + 1]
                                  .
                                  super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                  ._M_impl.super__Vector_impl_data + 8),args);
      Variable::~Variable((Variable *)(local_70 + 0x20));
    }
  }
  this_00->ScriptState = (State *)args;
  Nullable<LiteScript::Variable>::operator=(&this_00->class_base,in_R8);
  VVar6.nb_ref = extraout_RDX;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::Class::CreateElement(State& state, std::vector<Variable>& args, const Variable& self) {
    Variable v = this->memory.Create(Type::CLASS_OBJECT);
    ClassObject& co = v->GetData<ClassObject>();
    co.ClassBase = this;
    for (unsigned int i = 0, j = 0, sz = this->us_members.size(); i < sz; i++) {
        if (this->us_members[i].second->GetType() != Type::CALLBACK) {
            co.AddMember(this->us_members[i].first.c_str(), this->memory.Create(Type::NIL));
            co.GetMemberVariable(j) = this->us_members[i].second;
            j++;
        }
    }
    if (this->constructor_index != -1 && this->us_members[this->constructor_index].second->GetType() == Type::CALLBACK) {
        this->us_members[this->constructor_index].second->GetData<Callback>().This = Nullable<Variable>(v);
        this->us_members[this->constructor_index].second(state, args);
    }
    co.ScriptState = &state;
    co.class_base = self;
    return v;
}